

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcSymbol * __thiscall
CTcPrsSymtab::find(CTcPrsSymtab *this,textchar_t *sym,size_t len,CTcPrsSymtab **symtab)

{
  CTcSymbol *pCVar1;
  CTcPrsSymtab **in_RCX;
  size_t in_RDX;
  textchar_t *in_RSI;
  CTcPrsSymtab *in_RDI;
  CTcSymbol *entry;
  
  pCVar1 = find_noref(in_RDI,in_RSI,in_RDX,in_RCX);
  if (pCVar1 != (CTcSymbol *)0x0) {
    (*(pCVar1->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0xf])
              ();
  }
  return pCVar1;
}

Assistant:

CTcSymbol *CTcPrsSymtab::find(const textchar_t *sym, size_t len,
                              CTcPrsSymtab **symtab)
{
    CTcSymbol *entry;

    /* find the symbol */
    entry = find_noref(sym, len, symtab);

    /* if we found an entry, mark it as referenced */
    if (entry != 0)
        entry->mark_referenced();

    /* return the result */
    return entry;
}